

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

AGLFramebuffer aGLFramebufferCreate(AGLFramebufferCreate params)

{
  AGLFramebuffer AVar1;
  int iVar2;
  long in_stack_00000008;
  GLenum status;
  GLenum depth_component;
  AGLFramebuffer fbo;
  
  memset(&status,0,8);
  glGenFramebuffers(1,&status);
  glBindFramebuffer(0x8d40,status);
  if (in_stack_00000008 == 0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x55f,"params.color");
    aAppTerminate(-1);
  }
  if (in_stack_00000008 != 0) {
    glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,*(undefined4 *)(in_stack_00000008 + 0x24),0);
  }
  if ((int)params.color == 0) {
    glFramebufferRenderbuffer(0x8d40,0x8d00,0x8d41,0);
  }
  else if (params.depth._0_8_ == 0) {
    glGenRenderbuffers(1,&depth_component);
    glBindRenderbuffer(0x8d41,depth_component);
    glRenderbufferStorage
              (0x8d41,0x1902,*(undefined4 *)(in_stack_00000008 + 8),
               *(undefined4 *)(in_stack_00000008 + 0xc));
    glFramebufferRenderbuffer(0x8d40,0x8d00,0x8d41,depth_component);
    glBindRenderbuffer(0x8d41,0);
  }
  else {
    glFramebufferTexture2D(0x8d40,0x8d00,0xde1,*(undefined4 *)(params.depth._0_8_ + 0x24),0);
  }
  iVar2 = glCheckFramebufferStatus(0x8d40);
  if (iVar2 != 0x8cd5) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x57a,"status == GL_FRAMEBUFFER_COMPLETE");
    aAppTerminate(-1);
  }
  glBindFramebuffer(0x8d40,a__gl_state.framebuffer.binding);
  AVar1.depth_renderbuffer = depth_component;
  AVar1.name = status;
  return AVar1;
}

Assistant:

AGLFramebuffer aGLFramebufferCreate(AGLFramebufferCreate params) {
	AGLFramebuffer fbo = {0};
	AGL__CALL(glGenFramebuffers(1, &fbo.name));
	AGL__CALL(glBindFramebuffer(GL_FRAMEBUFFER, fbo.name));

	ATTO_ASSERT(params.color);

	if (params.color)
		AGL__CALL(glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, params.color->_.name, 0));

	if (params.depth.enable) {
		if (params.depth.texture) {
			AGL__CALL(glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, params.depth.texture->_.name, 0));
		} else {
#ifdef ATTO_GLES
			const GLenum depth_component = GL_DEPTH_COMPONENT16;
#else
			const GLenum depth_component = GL_DEPTH_COMPONENT;
#endif
			AGL__CALL(glGenRenderbuffers(1, &fbo.depth_renderbuffer));
			AGL__CALL(glBindRenderbuffer(GL_RENDERBUFFER, fbo.depth_renderbuffer));
			AGL__CALL(glRenderbufferStorage(GL_RENDERBUFFER, depth_component, params.color->width, params.color->height));
			AGL__CALL(glFramebufferRenderbuffer(GL_FRAMEBUFFER,
				GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, fbo.depth_renderbuffer));
			AGL__CALL(glBindRenderbuffer(GL_RENDERBUFFER, 0));
		}
	} else {
		// Depth disabled
		AGL__CALL(glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, 0));
	}

	const GLenum status = glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ATTO_ASSERT(status == GL_FRAMEBUFFER_COMPLETE);

	AGL__CALL(glBindFramebuffer(GL_FRAMEBUFFER, a__gl_state.framebuffer.binding));
	return fbo;
}